

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

DockWidgetArea __thiscall QMainWindowLayout::dockWidgetArea(QMainWindowLayout *this,QWidget *widget)

{
  DockWidgetArea DVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayout::indexOf((QList<int> *)&local_28,(QDockAreaLayout *)(this + 0x1a0),widget);
  if ((undefined1 *)local_28.size == (undefined1 *)0x0) {
    DVar1 = NoDockWidgetArea;
  }
  else {
    DVar1 = QDockWidgetPrivate::toDockWidgetArea(*local_28.ptr);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return DVar1;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DockWidgetArea QMainWindowLayout::dockWidgetArea(const QWidget *widget) const
{
    const QList<int> pathToWidget = layoutState.dockAreaLayout.indexOf(widget);
    if (pathToWidget.isEmpty())
        return Qt::NoDockWidgetArea;
    return toDockWidgetArea(pathToWidget.first());
}